

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O2

void __thiscall phoenix_flm_t::~phoenix_flm_t(phoenix_flm_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__phoenix_flm_t_001a20c0;
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_flm_t::flm_entry_t,_std::default_delete<phoenix_flm_t::flm_entry_t>_>_>_>_>_>
  ::~unique_ptr(&this->m_entries);
  std::__cxx11::string::~string((string *)&this->m_signature);
  return;
}

Assistant:

phoenix_flm_t::~phoenix_flm_t() {
    _clean_up();
}